

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_AES_PDF.cc
# Opt level: O1

ssize_t __thiscall Pl_AES_PDF::write(Pl_AES_PDF *this,int __fd,void *__buf,size_t __n)

{
  void *in_RAX;
  size_t bytes_left;
  uchar *p;
  undefined4 in_register_00000034;
  void *__n_00;
  void *__src;
  
  __src = (void *)CONCAT44(in_register_00000034,__fd);
  if (__buf != (void *)0x0) {
    do {
      if (this->offset == 0x10) {
        flush(this,false);
      }
      __n_00 = (void *)(0x10 - this->offset);
      if (__buf < __n_00) {
        __n_00 = __buf;
      }
      in_RAX = memcpy(this->inbuf + this->offset,__src,(size_t)__n_00);
      this->offset = this->offset + (long)__n_00;
      __src = (void *)((long)__src + (long)__n_00);
      __buf = (void *)((long)__buf - (long)__n_00);
    } while (__buf != (void *)0x0);
  }
  return (ssize_t)in_RAX;
}

Assistant:

void
Pl_AES_PDF::write(unsigned char const* data, size_t len)
{
    size_t bytes_left = len;
    unsigned char const* p = data;

    while (bytes_left > 0) {
        if (this->offset == this->buf_size) {
            flush(false);
        }

        size_t available = this->buf_size - this->offset;
        size_t bytes = (bytes_left < available ? bytes_left : available);
        bytes_left -= bytes;
        std::memcpy(this->inbuf + this->offset, p, bytes);
        this->offset += bytes;
        p += bytes;
    }
}